

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llist.c
# Opt level: O1

int Curl_llist_remove(curl_llist *list,curl_llist_element *e,void *user)

{
  curl_llist *pcVar1;
  curl_llist_element *pcVar2;
  
  if ((e != (curl_llist_element *)0x0) && (list->size != 0)) {
    pcVar1 = (curl_llist *)e->next;
    if (list->head == e) {
      list->head = (curl_llist_element *)pcVar1;
      pcVar2 = (curl_llist_element *)0x0;
    }
    else {
      pcVar2 = e->prev;
      pcVar2->next = (curl_llist_element *)pcVar1;
      pcVar1 = (curl_llist *)e->next;
    }
    if (pcVar1 == (curl_llist *)0x0) {
      pcVar1 = list;
    }
    pcVar1->tail = pcVar2;
    (*list->dtor)(user,e->ptr);
    e->ptr = (void *)0x0;
    e->prev = (curl_llist_element *)0x0;
    e->next = (curl_llist_element *)0x0;
    (*Curl_cfree)(e);
    list->size = list->size - 1;
  }
  return 1;
}

Assistant:

int
Curl_llist_remove(struct curl_llist *list, struct curl_llist_element *e,
                  void *user)
{
  if(e == NULL || list->size == 0)
    return 1;

  if(e == list->head) {
    list->head = e->next;

    if(list->head == NULL)
      list->tail = NULL;
    else
      e->next->prev = NULL;
  }
  else {
    e->prev->next = e->next;
    if(!e->next)
      list->tail = e->prev;
    else
      e->next->prev = e->prev;
  }

  list->dtor(user, e->ptr);

  e->ptr  = NULL;
  e->prev = NULL;
  e->next = NULL;

  free(e);
  --list->size;

  return 1;
}